

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.h
# Opt level: O2

void __thiscall TxInUndoFormatter::Ser<AutoFile>(TxInUndoFormatter *this,AutoFile *s,Coin *txout)

{
  long in_FS_OFFSET;
  uint local_24;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = *(uint *)&txout->field_0x28;
  local_20.m_object = &local_24;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>::Serialize<AutoFile>(&local_20,s);
  if (1 < *(uint *)&txout->field_0x28) {
    ser_writedata8<AutoFile>(s,'\0');
  }
  TxOutCompression::SerializationOps<AutoFile,CTxOut_const,ActionSerialize>(txout,s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream &s, const Coin& txout) {
        ::Serialize(s, VARINT(txout.nHeight * uint32_t{2} + txout.fCoinBase ));
        if (txout.nHeight > 0) {
            // Required to maintain compatibility with older undo format.
            ::Serialize(s, (unsigned char)0);
        }
        ::Serialize(s, Using<TxOutCompression>(txout.out));
    }